

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  long __off;
  undefined1 local_108 [8];
  stbi__context s;
  
  s.img_buffer_original = (stbi_uc *)comp;
  __off = ftell((FILE *)f);
  stbi__start_callbacks((stbi__context *)local_108,&stbi__stdio_callbacks,f);
  iVar1 = stbi__info_main((stbi__context *)local_108,x,y,(int *)s.img_buffer_original);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}